

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O3

void __thiscall
QAbstractProxyModelPrivate::mapDropCoordinatesToSource
          (QAbstractProxyModelPrivate *this,int row,int column,QModelIndex *parent,int *sourceRow,
          int *sourceColumn,QModelIndex *sourceParent)

{
  QObject *pQVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 local_90;
  quintptr local_88;
  QAbstractItemModel *pQStack_80;
  int local_78;
  int iStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  long *local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  QAbstractItemModel *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  *sourceRow = -1;
  *sourceColumn = -1;
  if ((column & row) == 0xffffffff) {
    (*pQVar1->_vptr_QObject[0x32])(&local_58,pQVar1,parent);
    (sourceParent->m).ptr = local_48;
    sourceParent->r = local_58;
    sourceParent->c = uStack_54;
    sourceParent->i = CONCAT44(uStack_4c,uStack_50);
  }
  else {
    iVar3 = (*pQVar1->_vptr_QObject[0xf])(pQVar1,parent);
    if (iVar3 == row) {
      (*pQVar1->_vptr_QObject[0x32])(&local_58,pQVar1,parent);
      (sourceParent->m).ptr = local_48;
      sourceParent->r = local_58;
      sourceParent->c = uStack_54;
      sourceParent->i = CONCAT44(uStack_4c,uStack_50);
      QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
      ::value(&this->model);
      pQVar2 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
      iVar3 = (*(pQVar2->super_QObject)._vptr_QObject[0xf])(pQVar2,sourceParent);
      *sourceRow = iVar3;
    }
    else {
      local_48 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = 0xaaaaaaaa;
      uStack_54 = 0xaaaaaaaa;
      uStack_50 = 0xaaaaaaaa;
      uStack_4c = 0xaaaaaaaa;
      (*pQVar1->_vptr_QObject[0xc])(&local_58,pQVar1,(ulong)(uint)row,(ulong)(uint)column,parent);
      local_68 = (long *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = -0x55555556;
      iStack_74 = -0x55555556;
      uStack_70 = 0xaaaaaaaa;
      uStack_6c = 0xaaaaaaaa;
      (*pQVar1->_vptr_QObject[0x32])(&local_78,pQVar1,&local_58);
      *sourceRow = local_78;
      *sourceColumn = iStack_74;
      if (local_68 == (long *)0x0) {
        local_90 = 0xffffffffffffffff;
        local_88 = 0;
        pQStack_80 = (QAbstractItemModel *)0x0;
      }
      else {
        (**(code **)(*local_68 + 0x68))(&local_90,local_68,&local_78);
      }
      (sourceParent->m).ptr = pQStack_80;
      sourceParent->r = (undefined4)local_90;
      sourceParent->c = local_90._4_4_;
      sourceParent->i = local_88;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractProxyModelPrivate::mapDropCoordinatesToSource(int row, int column, const QModelIndex &parent,
                                                            int *sourceRow, int *sourceColumn, QModelIndex *sourceParent) const
{
    Q_Q(const QAbstractProxyModel);
    *sourceRow = -1;
    *sourceColumn = -1;
    if (row == -1 && column == -1) {
        *sourceParent = q->mapToSource(parent);
    } else if (row == q->rowCount(parent)) {
        *sourceParent = q->mapToSource(parent);
        *sourceRow = model->rowCount(*sourceParent);
    } else {
        QModelIndex proxyIndex = q->index(row, column, parent);
        QModelIndex sourceIndex = q->mapToSource(proxyIndex);
        *sourceRow = sourceIndex.row();
        *sourceColumn = sourceIndex.column();
        *sourceParent = sourceIndex.parent();
    }
}